

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrPlaneDetectorBeginInfoEXT *value)

{
  pointer *this;
  pointer *this_00;
  bool bVar1;
  ValidateXrHandleResult VVar2;
  string local_910 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_8f0;
  allocator local_8d1;
  string local_8d0 [32];
  string local_8b0 [32];
  ostringstream local_890 [8];
  ostringstream oss_enum_1;
  allocator local_711;
  string local_710 [39];
  allocator local_6e9;
  string local_6e8 [32];
  uint local_6c8;
  allocator local_6c1;
  uint32_t value_semantictypes_inc;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_6a0;
  allocator local_681;
  string local_680 [32];
  string local_660 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_640;
  allocator local_621;
  string local_620 [32];
  string local_600 [32];
  ostringstream local_5e0 [8];
  ostringstream oss_enum;
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [32];
  uint local_418;
  allocator local_411;
  uint32_t value_orientations_inc;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3f0;
  allocator local_3d1;
  string local_3d0 [32];
  string local_3b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_390;
  allocator local_371;
  string local_370 [32];
  XrSpace_T local_350 [32];
  ostringstream local_330 [8];
  ostringstream oss;
  allocator local_1b1;
  ValidateXrHandleResult handle_result;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_190;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [40];
  string local_128 [8];
  string error_message;
  allocator local_101;
  string local_100 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e0;
  allocator local_c1;
  string local_c0 [52];
  NextChainResult local_8c;
  undefined1 local_88 [4];
  NextChainResult next_result;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrPlaneDetectorBeginInfoEXT *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_PLANE_DETECTOR_BEGIN_INFO_EXT) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrPlaneDetectorBeginInfoEXT",value->type,
               "VUID-XrPlaneDetectorBeginInfoEXT-type-type",XR_TYPE_PLANE_DETECTOR_BEGIN_INFO_EXT,
               "XR_TYPE_PLANE_DETECTOR_BEGIN_INFO_EXT");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    this_00 = &encountered_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this_00);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)this_00);
    if (local_8c == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"VUID-XrPlaneDetectorBeginInfoEXT-next-next",&local_c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_e0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "Invalid structure(s) in \"next\" chain for XrPlaneDetectorBeginInfoEXT struct \"next\""
                 ,&local_101);
      CoreValidLogMessage(instance_info,(string *)local_c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_e0,(string *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_e0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_8c == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_128,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_150 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x27));
      std::__cxx11::string::operator+=(local_128,"XrPlaneDetectorBeginInfoEXT : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_150,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_128,(string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_170,"VUID-XrPlaneDetectorBeginInfoEXT-next-unique",&local_171);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_190,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&handle_result,
                 "Multiple structures of the same type(s) in \"next\" chain for XrPlaneDetectorBeginInfoEXT struct"
                 ,&local_1b1);
      CoreValidLogMessage(instance_info,(string *)local_170,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_190,(string *)&handle_result);
      std::__cxx11::string::~string((string *)&handle_result);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_190);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_128);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    VVar2 = VerifyXrSpaceHandle(&value->baseSpace);
    if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
      if ((value->orientationCount == 0) ||
         (value->orientations != (XrPlaneDetectorOrientationEXT *)0x0)) {
        if (value->orientations != (XrPlaneDetectorOrientationEXT *)0x0) {
          for (local_418 = 0; local_418 < value->orientationCount; local_418 = local_418 + 1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_438,"XrPlaneDetectorBeginInfoEXT",&local_439);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_460,"orientations",&local_461);
            bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_438,
                                   (string *)local_460,objects_info,value->orientations[local_418]);
            std::__cxx11::string::~string(local_460);
            std::allocator<char>::~allocator((allocator<char> *)&local_461);
            std::__cxx11::string::~string(local_438);
            std::allocator<char>::~allocator((allocator<char> *)&local_439);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              std::__cxx11::ostringstream::ostringstream(local_5e0);
              std::operator<<((ostream *)local_5e0,
                              "XrPlaneDetectorBeginInfoEXT contains invalid XrPlaneDetectorOrientationEXT \"orientations\" enum value "
                             );
              Uint32ToHexString_abi_cxx11_((uint32_t)local_600);
              std::operator<<((ostream *)local_5e0,local_600);
              std::__cxx11::string::~string(local_600);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_620,"VUID-XrPlaneDetectorBeginInfoEXT-orientations-parameter",
                         &local_621);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_640,objects_info);
              std::__cxx11::ostringstream::str();
              CoreValidLogMessage(instance_info,(string *)local_620,VALID_USAGE_DEBUG_SEVERITY_ERROR
                                  ,command_name,&local_640,local_660);
              std::__cxx11::string::~string((string *)local_660);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~vector(&local_640);
              std::__cxx11::string::~string(local_620);
              std::allocator<char>::~allocator((allocator<char> *)&local_621);
              std::__cxx11::ostringstream::~ostringstream(local_5e0);
              return XR_ERROR_VALIDATION_FAILURE;
            }
          }
        }
        if ((value->semanticTypeCount == 0) ||
           (value->semanticTypes != (XrPlaneDetectorSemanticTypeEXT *)0x0)) {
          if (value->semanticTypes != (XrPlaneDetectorSemanticTypeEXT *)0x0) {
            for (local_6c8 = 0; local_6c8 < value->semanticTypeCount; local_6c8 = local_6c8 + 1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_6e8,"XrPlaneDetectorBeginInfoEXT",&local_6e9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_710,"semanticTypes",&local_711);
              bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_6e8,
                                     (string *)local_710,objects_info,
                                     value->semanticTypes[local_6c8]);
              std::__cxx11::string::~string(local_710);
              std::allocator<char>::~allocator((allocator<char> *)&local_711);
              std::__cxx11::string::~string(local_6e8);
              std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                std::__cxx11::ostringstream::ostringstream(local_890);
                std::operator<<((ostream *)local_890,
                                "XrPlaneDetectorBeginInfoEXT contains invalid XrPlaneDetectorSemanticTypeEXT \"semanticTypes\" enum value "
                               );
                Uint32ToHexString_abi_cxx11_((uint32_t)local_8b0);
                std::operator<<((ostream *)local_890,local_8b0);
                std::__cxx11::string::~string(local_8b0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_8d0,"VUID-XrPlaneDetectorBeginInfoEXT-semanticTypes-parameter",
                           &local_8d1);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_8f0,objects_info);
                std::__cxx11::ostringstream::str();
                CoreValidLogMessage(instance_info,(string *)local_8d0,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_8f0,
                                    local_910);
                std::__cxx11::string::~string((string *)local_910);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                ~vector(&local_8f0);
                std::__cxx11::string::~string(local_8d0);
                std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
                std::__cxx11::ostringstream::~ostringstream(local_890);
                return XR_ERROR_VALIDATION_FAILURE;
              }
            }
          }
          instance_info_local._4_4_ =
               valid_ext_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_680,"VUID-XrPlaneDetectorBeginInfoEXT-semanticTypes-parameter",&local_681
                    );
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_6a0,objects_info);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&value_semantictypes_inc,
                     "Structure XrPlaneDetectorBeginInfoEXT member semanticTypeCount is NULL, but value->semanticTypeCount is greater than 0"
                     ,&local_6c1);
          CoreValidLogMessage(instance_info,(string *)local_680,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_6a0,(string *)&value_semantictypes_inc);
          std::__cxx11::string::~string((string *)&value_semantictypes_inc);
          std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_6a0);
          std::__cxx11::string::~string(local_680);
          std::allocator<char>::~allocator((allocator<char> *)&local_681);
          instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3d0,"VUID-XrPlaneDetectorBeginInfoEXT-orientations-parameter",&local_3d1);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3f0,objects_info);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&value_orientations_inc,
                   "Structure XrPlaneDetectorBeginInfoEXT member orientationCount is NULL, but value->orientationCount is greater than 0"
                   ,&local_411);
        CoreValidLogMessage(instance_info,(string *)local_3d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_3f0,(string *)&value_orientations_inc);
        std::__cxx11::string::~string((string *)&value_orientations_inc);
        std::allocator<char>::~allocator((allocator<char> *)&local_411);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3f0);
        std::__cxx11::string::~string(local_3d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
        instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_330);
      std::operator<<((ostream *)local_330,"Invalid XrSpace handle \"baseSpace\" ");
      HandleToHexString<XrSpace_T*>(local_350);
      std::operator<<((ostream *)local_330,(string *)local_350);
      std::__cxx11::string::~string((string *)local_350);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_370,"VUID-XrPlaneDetectorBeginInfoEXT-baseSpace-parameter",&local_371);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_390,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_370,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_390,local_3b0);
      std::__cxx11::string::~string((string *)local_3b0);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_390);
      std::__cxx11::string::~string(local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
      instance_info_local._4_4_ = XR_ERROR_HANDLE_INVALID;
      std::__cxx11::ostringstream::~ostringstream(local_330);
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrPlaneDetectorBeginInfoEXT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_PLANE_DETECTOR_BEGIN_INFO_EXT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrPlaneDetectorBeginInfoEXT",
                             value->type, "VUID-XrPlaneDetectorBeginInfoEXT-type-type", XR_TYPE_PLANE_DETECTOR_BEGIN_INFO_EXT, "XR_TYPE_PLANE_DETECTOR_BEGIN_INFO_EXT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorBeginInfoEXT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrPlaneDetectorBeginInfoEXT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrPlaneDetectorBeginInfoEXT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorBeginInfoEXT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrPlaneDetectorBeginInfoEXT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    {
        // writeValidateInlineHandleValidation
        ValidateXrHandleResult handle_result = VerifyXrSpaceHandle(&value->baseSpace);
        if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
            // Not a valid handle or NULL (which is not valid in this case)
            std::ostringstream oss;
            oss << "Invalid XrSpace handle \"baseSpace\" ";
            oss << HandleToHexString(value->baseSpace);
            CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorBeginInfoEXT-baseSpace-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, oss.str());
            return XR_ERROR_HANDLE_INVALID;
        }
    }
    // Optional array must be non-NULL when value->orientationCount is non-zero
    if (0 != value->orientationCount && nullptr == value->orientations) {
        CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorBeginInfoEXT-orientations-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrPlaneDetectorBeginInfoEXT member orientationCount is NULL, but value->orientationCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->orientations) {
        for (uint32_t value_orientations_inc = 0; value_orientations_inc < value->orientationCount; ++value_orientations_inc) {
            // Make sure the enum type XrPlaneDetectorOrientationEXT value is valid
            if (!ValidateXrEnum(instance_info, command_name, "XrPlaneDetectorBeginInfoEXT", "orientations", objects_info, value->orientations[value_orientations_inc])) {
                std::ostringstream oss_enum;
                oss_enum << "XrPlaneDetectorBeginInfoEXT contains invalid XrPlaneDetectorOrientationEXT \"orientations\" enum value ";
                oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->orientations[value_orientations_inc]));
                CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorBeginInfoEXT-orientations-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, oss_enum.str());
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Optional array must be non-NULL when value->semanticTypeCount is non-zero
    if (0 != value->semanticTypeCount && nullptr == value->semanticTypes) {
        CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorBeginInfoEXT-semanticTypes-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrPlaneDetectorBeginInfoEXT member semanticTypeCount is NULL, but value->semanticTypeCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->semanticTypes) {
        for (uint32_t value_semantictypes_inc = 0; value_semantictypes_inc < value->semanticTypeCount; ++value_semantictypes_inc) {
            // Make sure the enum type XrPlaneDetectorSemanticTypeEXT value is valid
            if (!ValidateXrEnum(instance_info, command_name, "XrPlaneDetectorBeginInfoEXT", "semanticTypes", objects_info, value->semanticTypes[value_semantictypes_inc])) {
                std::ostringstream oss_enum;
                oss_enum << "XrPlaneDetectorBeginInfoEXT contains invalid XrPlaneDetectorSemanticTypeEXT \"semanticTypes\" enum value ";
                oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->semanticTypes[value_semantictypes_inc]));
                CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorBeginInfoEXT-semanticTypes-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, oss_enum.str());
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}